

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse.cpp
# Opt level: O3

void __thiscall
test_matrix_sparse_constructors_initialiser_lists_Test::TestBody
          (test_matrix_sparse_constructors_initialiser_lists_Test *this)

{
  pointer *ppdVar1;
  initializer_list<double> value;
  initializer_list<double> value_00;
  initializer_list<double> value_01;
  initializer_list<double> value_02;
  initializer_list<double> value_03;
  initializer_list<double> value_04;
  initializer_list<double> value_05;
  element_type *peVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  Scalar *pSVar6;
  char *pcVar7;
  StringLike<const_char_*> *regex;
  StringLike<const_char_*> *regex_00;
  StringLike<const_char_*> *regex_01;
  StringLike<const_char_*> *regex_02;
  StringLike<const_char_*> *regex_03;
  StringLike<const_char_*> *regex_04;
  undefined1 auVar8 [8];
  initializer_list<unsigned_long> non_zero;
  initializer_list<unsigned_long> non_zero_00;
  initializer_list<unsigned_long> non_zero_01;
  initializer_list<unsigned_long> non_zero_02;
  initializer_list<unsigned_long> non_zero_03;
  initializer_list<unsigned_long> non_zero_04;
  initializer_list<unsigned_long> non_zero_05;
  initializer_list<unsigned_long> index;
  initializer_list<unsigned_long> index_00;
  initializer_list<unsigned_long> index_01;
  initializer_list<unsigned_long> index_02;
  initializer_list<unsigned_long> index_03;
  initializer_list<unsigned_long> index_04;
  initializer_list<unsigned_long> index_05;
  DeathTest *gtest_dt;
  Matrix_Sparse matrix;
  element_type *local_410;
  undefined1 local_408 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_400;
  undefined1 *local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  Matrix_Sparse local_3c8;
  undefined1 *local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  pointer *local_360;
  undefined8 uStack_358;
  pointer *local_350;
  undefined8 uStack_348;
  pointer *local_340;
  undefined8 uStack_338;
  pointer *local_330;
  undefined8 uStack_328;
  PolymorphicMatcher *local_320;
  undefined8 uStack_318;
  Matrix_Sparse *local_310;
  undefined8 uStack_308;
  Matrix_Sparse *local_300;
  undefined8 uStack_2f8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2f0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2d8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2c0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_2a8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_290;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_278;
  Matrix_Sparse local_260;
  Matrix_Sparse local_210;
  Matrix_Sparse local_1c0;
  Matrix_Sparse local_170;
  Matrix_Sparse local_120;
  Matrix_Sparse local_d0;
  Matrix_Sparse local_80;
  
  local_378 = (undefined1 *)0x5;
  uStack_370 = 5;
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c8.column_size = 2;
  local_368 = 7;
  local_3e8 = 3;
  uStack_3e0 = 4;
  local_3f8 = (undefined1 *)0x2;
  uStack_3f0 = 0;
  local_408 = (undefined1  [8])0x1;
  _Stack_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  local_3d8 = 3;
  local_300 = &local_3c8;
  local_3c8.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x4014000000000000;
  local_3c8.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4018000000000000;
  local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_4008000000000000;
  local_3c8.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4010000000000000;
  local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
  local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x4000000000000000;
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x401c000000000000;
  uStack_2f8 = 7;
  value._M_len = 7;
  value._M_array = (iterator)local_300;
  non_zero._M_len = 5;
  non_zero._M_array =
       (iterator)
       &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  index._M_len = 7;
  index._M_array = (iterator)local_408;
  Disa::Matrix_Sparse::Matrix_Sparse(&local_260,non_zero,index,value,5);
  local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_260.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_260.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_start =
         (pointer)(((long)local_260.row_non_zero.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_260.row_non_zero.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start >> 3) + -1);
  }
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,4);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_408,"matrix.size_row()","4",(unsigned_long *)&local_3c8,
             (int *)&local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x29,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_260.column_size;
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,5);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_408,"matrix.size_column()","5",(unsigned_long *)&local_3c8,
             (int *)&local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2a,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)local_260.column_index.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_260.column_index.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT44(local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,7);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_408,"matrix.size_non_zero()","7",(unsigned_long *)&local_3c8,
             (int *)&local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2b,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Disa::Matrix_Sparse::operator[](&local_3c8,(size_t *)&local_260);
  local_410 = (element_type *)0x1;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_3c8,(size_t *)&local_410);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_408,"matrix[0][1]","1.0",*pSVar6,1.0);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2c,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Disa::Matrix_Sparse::operator[](&local_3c8,(size_t *)&local_260);
  local_410 = (element_type *)0x3;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_3c8,(size_t *)&local_410);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_408,"matrix[0][3]","2.0",*pSVar6,2.0);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2d,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  Disa::Matrix_Sparse::operator[](&local_3c8,(size_t *)&local_260);
  local_410 = (element_type *)0x0;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_3c8,(size_t *)&local_410);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_408,"matrix[1][0]","4.0",*pSVar6,4.0);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2e,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  Disa::Matrix_Sparse::operator[](&local_3c8,(size_t *)&local_260);
  local_410 = (element_type *)0x2;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_3c8,(size_t *)&local_410);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_408,"matrix[1][2]","3.0",*pSVar6,3.0);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x2f,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  Disa::Matrix_Sparse::operator[](&local_3c8,(size_t *)&local_260);
  local_410 = (element_type *)0x3;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_3c8,(size_t *)&local_410);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_408,"matrix[1][3]","5.0",*pSVar6,5.0);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x30,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3;
  Disa::Matrix_Sparse::operator[](&local_3c8,(size_t *)&local_260);
  local_410 = (element_type *)0x3;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_3c8,(size_t *)&local_410);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_408,"matrix[3][3]","7.0",*pSVar6,7.0);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x31,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  ppdVar1 = &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3;
  Disa::Matrix_Sparse::operator[](&local_3c8,(size_t *)&local_260);
  local_410 = (element_type *)&DAT_00000004;
  pSVar6 = Disa::Matrix_Sparse_Row<Disa::Matrix_Sparse>::operator[]<Disa::Matrix_Sparse,_true>
                     ((Matrix_Sparse_Row<Disa::Matrix_Sparse> *)&local_3c8,(size_t *)&local_410);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_408,"matrix[3][4]","6.0",*pSVar6,6.0);
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_3c8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((_Alloc_hider *)&(_Stack_400._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x32,pcVar7);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Message *)&local_3c8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_3c8.row_non_zero.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_400,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_400._M_pi);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x168329;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_408,
               (testing *)&local_3c8,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_278,(PolymorphicMatcher *)local_408);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_400._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({0, 2, 3}, {1, 0, 0, 1}, {1.0, 2.0, 3.0, 4.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_278,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x36,(DeathTest **)&local_410);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_278);
    auVar8 = (undefined1  [8])local_410;
    if (!bVar3) goto LAB_0010f887;
    if (local_410 != (element_type *)0x0) {
      iVar5 = (**(code **)(local_410->pattern_ + 0x10))(local_410);
      peVar2 = local_410;
      if (iVar5 == 0) {
        iVar5 = (**(code **)(local_410->pattern_ + 0x18))(local_410);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        cVar4 = (**(code **)(peVar2->pattern_ + 0x20))(peVar2,bVar3);
        if (cVar4 == '\0') {
          (**(code **)(((element_type *)auVar8)->pattern_ + 8))(auVar8);
          goto LAB_0010f887;
        }
      }
      else if (iVar5 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_3c8.column_size = 2;
          local_378 = (undefined1 *)0x3;
          local_3f8 = (undefined1 *)0x0;
          uStack_3f0 = 1;
          local_408 = (undefined1  [8])0x1;
          _Stack_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_4008000000000000;
          local_3c8.column_index.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x4010000000000000;
          local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
          local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x4000000000000000;
          uStack_308 = 4;
          value_00._M_len = 4;
          value_00._M_array = (iterator)&local_3c8;
          non_zero_00._M_len = 3;
          non_zero_00._M_array =
               (iterator)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
          index_00._M_len = 4;
          index_00._M_array = (iterator)local_408;
          local_310 = &local_3c8;
          Disa::Matrix_Sparse::Matrix_Sparse(&local_80,non_zero_00,index_00,value_00,2);
          Disa::Matrix_Sparse::~Matrix_Sparse(&local_80);
        }
        (**(code **)(local_410->pattern_ + 0x28))(local_410,2);
        (**(code **)(peVar2->pattern_ + 0x28))(peVar2,0);
      }
      pcVar7 = ((element_type *)auVar8)->pattern_;
      goto LAB_0010f8da;
    }
  }
  else {
LAB_0010f887:
    testing::Message::Message((Message *)local_408);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x36,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3c8,(Message *)local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
    if (local_408 != (undefined1  [8])0x0) {
      pcVar7 = *(char **)local_408;
      auVar8 = local_408;
LAB_0010f8da:
      (**(code **)(pcVar7 + 8))(auVar8);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x168329;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_408,
               (testing *)&local_3c8,regex_00);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_290,(PolymorphicMatcher *)local_408);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_400._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({0, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0, 4.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_290,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x37,(DeathTest **)&local_410);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_290);
    auVar8 = (undefined1  [8])local_410;
    if (!bVar3) goto LAB_0010fa85;
    if (local_410 != (element_type *)0x0) {
      iVar5 = (**(code **)(local_410->pattern_ + 0x10))(local_410);
      peVar2 = local_410;
      if (iVar5 == 0) {
        iVar5 = (**(code **)(local_410->pattern_ + 0x18))(local_410);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        cVar4 = (**(code **)(peVar2->pattern_ + 0x20))(peVar2,bVar3);
        if (cVar4 == '\0') {
          (**(code **)(((element_type *)auVar8)->pattern_ + 8))(auVar8);
          goto LAB_0010fa85;
        }
      }
      else if (iVar5 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
          local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x3;
          local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
          local_3c8.column_size = 0;
          local_378 = (undefined1 *)0x0;
          local_3f8 = &DAT_4008000000000000;
          uStack_3f0 = 0x4010000000000000;
          local_408 = (undefined1  [8])0x3ff0000000000000;
          _Stack_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4000000000000000;
          uStack_318 = 4;
          value_01._M_len = 4;
          value_01._M_array = (iterator)local_408;
          non_zero_01._M_len = 3;
          non_zero_01._M_array = (iterator)&local_3c8;
          index_01._M_len = 3;
          index_01._M_array =
               (iterator)
               &local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
          local_320 = (PolymorphicMatcher *)local_408;
          Disa::Matrix_Sparse::Matrix_Sparse(&local_d0,non_zero_01,index_01,value_01,2);
          Disa::Matrix_Sparse::~Matrix_Sparse(&local_d0);
        }
        (**(code **)(local_410->pattern_ + 0x28))(local_410,2);
        (**(code **)(peVar2->pattern_ + 0x28))(peVar2,0);
      }
      pcVar7 = ((element_type *)auVar8)->pattern_;
      goto LAB_0010fad8;
    }
  }
  else {
LAB_0010fa85:
    testing::Message::Message((Message *)local_408);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x37,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3c8,(Message *)local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
    if (local_408 != (undefined1  [8])0x0) {
      pcVar7 = *(char **)local_408;
      auVar8 = local_408;
LAB_0010fad8:
      (**(code **)(pcVar7 + 8))(auVar8);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x168329;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_408,
               (testing *)&local_3c8,regex_01);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_2a8,(PolymorphicMatcher *)local_408);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_400._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({1, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_2a8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x38,(DeathTest **)&local_410);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_2a8);
    auVar8 = (undefined1  [8])local_410;
    if (!bVar3) goto LAB_0010fc83;
    if (local_410 != (element_type *)0x0) {
      iVar5 = (**(code **)(local_410->pattern_ + 0x10))(local_410);
      peVar2 = local_410;
      if (iVar5 == 0) {
        iVar5 = (**(code **)(local_410->pattern_ + 0x18))(local_410);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        cVar4 = (**(code **)(peVar2->pattern_ + 0x20))(peVar2,bVar3);
        if (cVar4 == '\0') {
          (**(code **)(((element_type *)auVar8)->pattern_ + 8))(auVar8);
          goto LAB_0010fc83;
        }
      }
      else if (iVar5 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          local_408 = (undefined1  [8])0x1;
          _Stack_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
          local_3f8 = (undefined1 *)0x3;
          local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
          local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff0000000000000;
          local_3c8.column_size = 0x4000000000000000;
          local_378 = &DAT_4008000000000000;
          uStack_328 = 3;
          value_02._M_len = 3;
          value_02._M_array = (iterator)ppdVar1;
          non_zero_02._M_len = 3;
          non_zero_02._M_array = (iterator)local_408;
          index_02._M_len = 3;
          index_02._M_array = (iterator)&local_3c8;
          local_330 = ppdVar1;
          Disa::Matrix_Sparse::Matrix_Sparse(&local_120,non_zero_02,index_02,value_02,2);
          Disa::Matrix_Sparse::~Matrix_Sparse(&local_120);
        }
        (**(code **)(local_410->pattern_ + 0x28))(local_410,2);
        (**(code **)(peVar2->pattern_ + 0x28))(peVar2,0);
      }
      pcVar7 = ((element_type *)auVar8)->pattern_;
      goto LAB_0010fcd6;
    }
  }
  else {
LAB_0010fc83:
    testing::Message::Message((Message *)local_408);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x38,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3c8,(Message *)local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
    if (local_408 != (undefined1  [8])0x0) {
      pcVar7 = *(char **)local_408;
      auVar8 = local_408;
LAB_0010fcd6:
      (**(code **)(pcVar7 + 8))(auVar8);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x168329;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_408,
               (testing *)&local_3c8,regex_02);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_2c0,(PolymorphicMatcher *)local_408);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_400._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({2, 0, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_2c0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x39,(DeathTest **)&local_410);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_2c0);
    auVar8 = (undefined1  [8])local_410;
    if (!bVar3) goto LAB_0010fe81;
    if (local_410 != (element_type *)0x0) {
      iVar5 = (**(code **)(local_410->pattern_ + 0x10))(local_410);
      peVar2 = local_410;
      if (iVar5 == 0) {
        iVar5 = (**(code **)(local_410->pattern_ + 0x18))(local_410);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        cVar4 = (**(code **)(peVar2->pattern_ + 0x20))(peVar2,bVar3);
        if (cVar4 == '\0') {
          (**(code **)(((element_type *)auVar8)->pattern_ + 8))(auVar8);
          goto LAB_0010fe81;
        }
      }
      else if (iVar5 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          local_408 = (undefined1  [8])0x2;
          _Stack_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_3f8 = (undefined1 *)0x3;
          local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
          local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff0000000000000;
          local_3c8.column_size = 0x4000000000000000;
          local_378 = &DAT_4008000000000000;
          uStack_338 = 3;
          value_03._M_len = 3;
          value_03._M_array = (iterator)ppdVar1;
          non_zero_03._M_len = 3;
          non_zero_03._M_array = (iterator)local_408;
          index_03._M_len = 3;
          index_03._M_array = (iterator)&local_3c8;
          local_340 = ppdVar1;
          Disa::Matrix_Sparse::Matrix_Sparse(&local_170,non_zero_03,index_03,value_03,2);
          Disa::Matrix_Sparse::~Matrix_Sparse(&local_170);
        }
        (**(code **)(local_410->pattern_ + 0x28))(local_410,2);
        (**(code **)(peVar2->pattern_ + 0x28))(peVar2,0);
      }
      pcVar7 = ((element_type *)auVar8)->pattern_;
      goto LAB_0010fed4;
    }
  }
  else {
LAB_0010fe81:
    testing::Message::Message((Message *)local_408);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x39,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3c8,(Message *)local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
    if (local_408 != (undefined1  [8])0x0) {
      pcVar7 = *(char **)local_408;
      auVar8 = local_408;
LAB_0010fed4:
      (**(code **)(pcVar7 + 8))(auVar8);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x168329;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_408,
               (testing *)&local_3c8,regex_03);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_2d8,(PolymorphicMatcher *)local_408);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_400._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({0, 2, 3}, {1, 0, 2}, {1.0, 2.0, 3.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_2d8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x3a,(DeathTest **)&local_410);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_2d8);
    auVar8 = (undefined1  [8])local_410;
    if (!bVar3) goto LAB_0011007f;
    if (local_410 != (element_type *)0x0) {
      iVar5 = (**(code **)(local_410->pattern_ + 0x10))(local_410);
      peVar2 = local_410;
      if (iVar5 == 0) {
        iVar5 = (**(code **)(local_410->pattern_ + 0x18))(local_410);
        bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
        cVar4 = (**(code **)(peVar2->pattern_ + 0x20))(peVar2,bVar3);
        if (cVar4 == '\0') {
          (**(code **)(((element_type *)auVar8)->pattern_ + 8))(auVar8);
          goto LAB_0011007f;
        }
      }
      else if (iVar5 == 1) {
        bVar3 = testing::internal::AlwaysTrue();
        if (bVar3) {
          local_408 = (undefined1  [8])0x0;
          _Stack_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
          local_3f8 = (undefined1 *)0x3;
          local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
          local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
          local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff0000000000000;
          local_3c8.column_size = 0x4000000000000000;
          local_378 = &DAT_4008000000000000;
          uStack_348 = 3;
          value_04._M_len = 3;
          value_04._M_array = (iterator)ppdVar1;
          non_zero_04._M_len = 3;
          non_zero_04._M_array = (iterator)local_408;
          index_04._M_len = 3;
          index_04._M_array = (iterator)&local_3c8;
          local_350 = ppdVar1;
          Disa::Matrix_Sparse::Matrix_Sparse(&local_1c0,non_zero_04,index_04,value_04,2);
          Disa::Matrix_Sparse::~Matrix_Sparse(&local_1c0);
        }
        (**(code **)(local_410->pattern_ + 0x28))(local_410,2);
        (**(code **)(peVar2->pattern_ + 0x28))(peVar2,0);
      }
      pcVar7 = ((element_type *)auVar8)->pattern_;
      goto LAB_001100d2;
    }
  }
  else {
LAB_0011007f:
    testing::Message::Message((Message *)local_408);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x3a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3c8,(Message *)local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
    if (local_408 != (undefined1  [8])0x0) {
      pcVar7 = *(char **)local_408;
      auVar8 = local_408;
LAB_001100d2:
      (**(code **)(pcVar7 + 8))(auVar8);
    }
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x168329;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_408,
               (testing *)&local_3c8,regex_04);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_2f0,(PolymorphicMatcher *)local_408);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_400._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_400._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("Matrix_Sparse({0, 2, 3}, {1, 1, 0}, {1.0, 2.0, 3.0}, 2)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_2f0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
                       ,0x3b,(DeathTest **)&local_410);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_2f0);
    auVar8 = (undefined1  [8])local_410;
    if (!bVar3) goto LAB_0011027d;
    if (local_410 == (element_type *)0x0) goto LAB_001102d3;
    iVar5 = (**(code **)(local_410->pattern_ + 0x10))(local_410);
    peVar2 = local_410;
    if (iVar5 == 0) {
      iVar5 = (**(code **)(local_410->pattern_ + 0x18))(local_410);
      bVar3 = testing::internal::ExitedUnsuccessfully(iVar5);
      cVar4 = (**(code **)(peVar2->pattern_ + 0x20))(peVar2,bVar3);
      if (cVar4 == '\0') {
        (**(code **)(((element_type *)auVar8)->pattern_ + 8))(auVar8);
        goto LAB_0011027d;
      }
    }
    else if (iVar5 == 1) {
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        local_408 = (undefined1  [8])0x0;
        _Stack_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
        local_3f8 = (undefined1 *)0x3;
        local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
        local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
        local_3c8.row_non_zero.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_3c8.element_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x3ff0000000000000;
        local_3c8.column_size = 0x4000000000000000;
        local_378 = &DAT_4008000000000000;
        uStack_358 = 3;
        value_05._M_len = 3;
        value_05._M_array = (iterator)ppdVar1;
        non_zero_05._M_len = 3;
        non_zero_05._M_array = (iterator)local_408;
        index_05._M_len = 3;
        index_05._M_array = (iterator)&local_3c8;
        local_360 = ppdVar1;
        Disa::Matrix_Sparse::Matrix_Sparse(&local_210,non_zero_05,index_05,value_05,2);
        Disa::Matrix_Sparse::~Matrix_Sparse(&local_210);
      }
      (**(code **)(local_410->pattern_ + 0x28))(local_410,2);
      (**(code **)(peVar2->pattern_ + 0x28))(peVar2,0);
    }
    pcVar7 = ((element_type *)auVar8)->pattern_;
  }
  else {
LAB_0011027d:
    testing::Message::Message((Message *)local_408);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse.cpp"
               ,0x3b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_3c8,(Message *)local_408);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_3c8);
    if (local_408 == (undefined1  [8])0x0) goto LAB_001102d3;
    pcVar7 = *(char **)local_408;
    auVar8 = local_408;
  }
  (**(code **)(pcVar7 + 8))(auVar8);
LAB_001102d3:
  Disa::Matrix_Sparse::~Matrix_Sparse(&local_260);
  return;
}

Assistant:

TEST(test_matrix_sparse, constructors_initialiser_lists) {
  Matrix_Sparse matrix({0, 2, 5, 5, 7}, {1, 3, 2, 0, 3, 4, 3}, {1.0, 2.0, 3.0, 4.0, 5.0, 6.0, 7.0}, 5);
  EXPECT_EQ(matrix.size_row(), 4);
  EXPECT_EQ(matrix.size_column(), 5);
  EXPECT_EQ(matrix.size_non_zero(), 7);
  EXPECT_DOUBLE_EQ(matrix[0][1], 1.0);
  EXPECT_DOUBLE_EQ(matrix[0][3], 2.0);
  EXPECT_DOUBLE_EQ(matrix[1][0], 4.0);
  EXPECT_DOUBLE_EQ(matrix[1][2], 3.0);
  EXPECT_DOUBLE_EQ(matrix[1][3], 5.0);
  EXPECT_DOUBLE_EQ(matrix[3][3], 7.0);
  EXPECT_DOUBLE_EQ(matrix[3][4], 6.0);

  // Valid construction 2x2: Matrix_Sparse({0, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2)
  EXPECT_DEATH(Matrix_Sparse({0, 2, 3}, {1, 0, 0, 1}, {1.0, 2.0, 3.0, 4.0}, 2),
               ".*");  // more column indexes than non-zero.back().
  EXPECT_DEATH(Matrix_Sparse({0, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0, 4.0}, 2), ".*");  // mismatch column and entry size.
  EXPECT_DEATH(Matrix_Sparse({1, 2, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2), ".*");       // first non-zero value is not 0.
  EXPECT_DEATH(Matrix_Sparse({2, 0, 3}, {1, 0, 0}, {1.0, 2.0, 3.0}, 2), ".*");       // un-ordered non-zeros
  EXPECT_DEATH(Matrix_Sparse({0, 2, 3}, {1, 0, 2}, {1.0, 2.0, 3.0}, 2), ".*");       // column index out of range
  EXPECT_DEATH(Matrix_Sparse({0, 2, 3}, {1, 1, 0}, {1.0, 2.0, 3.0}, 2), ".*");       // repeated column index
}